

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseQueue.cpp
# Opt level: O0

int __thiscall Kernel::ClauseQueue::remove(ClauseQueue *this,char *__filename)

{
  Node *__ptr;
  uint uVar1;
  ulong uVar2;
  Node *pNVar3;
  uint height;
  Node *next;
  Node *left;
  uint h;
  byte local_41;
  Node *local_28;
  uint local_1c;
  undefined1 local_1;
  
  local_1c = this->_height;
  __ptr = this->_left;
LAB_0084aa78:
  local_28 = __ptr;
  __ptr = local_28->nodes[local_1c];
  pNVar3 = __ptr;
  if ((__ptr == (Node *)0x0) || (pNVar3 = (Node *)__filename, (Clause *)__filename != __ptr->clause)
     ) {
    if (__ptr != (Node *)0x0) goto code_r0x0084ab7b;
    goto LAB_0084ab99;
  }
  while (local_28->nodes[local_1c] = __ptr->nodes[local_1c], local_1c != 0) {
    local_1c = local_1c - 1;
    for (; local_28->nodes[local_1c] != __ptr; local_28 = local_28->nodes[local_1c]) {
    }
  }
  Lib::free(__ptr);
  while( true ) {
    uVar2 = 0;
    local_41 = 0;
    if (this->_height != 0) {
      uVar2 = CONCAT71((int7)((ulong)this->_left >> 8),
                       this->_left->nodes[this->_height] != (Node *)0x0) ^ 0xff;
      local_41 = (byte)uVar2;
    }
    pNVar3 = (Node *)CONCAT71((int7)(uVar2 >> 8),local_41);
    if ((local_41 & 1) == 0) break;
    this->_height = this->_height - 1;
  }
  local_1 = 1;
  goto LAB_0084abc3;
code_r0x0084ab7b:
  uVar1 = (*this->_vptr_ClauseQueue[2])(this,__filename,__ptr->clause);
  pNVar3 = (Node *)(ulong)uVar1;
  if ((uVar1 & 1) == 0) goto LAB_0084aa78;
LAB_0084ab99:
  if (local_1c != 0) {
    local_1c = local_1c - 1;
    __ptr = local_28;
    goto LAB_0084aa78;
  }
  local_1 = 0;
LAB_0084abc3:
  return (int)CONCAT71((int7)((ulong)pNVar3 >> 8),local_1);
}

Assistant:

bool ClauseQueue::remove(Clause* c)
{
  unsigned h = _height;
  Node* left = _left;

  for (;;) {
    Node* next = left->nodes[h];
    if (next && c == next->clause) {
      unsigned height = h;
      // found, first change the links going to next
      for (;;) {
	left->nodes[h] = next->nodes[h];
	if (h == 0) {
	  break;
	}
	h--;
	while (left->nodes[h] != next) {
	  left = left->nodes[h];
	}
      }
      // deallocate the node
      DEALLOC_KNOWN(next,
		    sizeof(Node)+height*sizeof(Node*),
		    "ClauseQueue::Node");
      while (_height > 0 && ! _left->nodes[_height]) {
	_height--;
      }
      return true;
    }

    if (next == 0 || lessThan(c,next->clause)) {
      if(h==0) {

#if VDEBUG
       ClauseQueue::Iterator it(*this);
       while(it.hasNext()){
         ASS(it.next()!=c);
       }
#endif

	return false;
      }
      h--;
    }
    else {
      left = next;
    }
  }
}